

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cygwin.cpp
# Opt level: O2

string * fs_convert_path_abi_cxx11_(string *__return_storage_ptr__,string_view path,int what)

{
  string_view fname;
  
  fname._M_str = "fs_convert_path";
  fname._M_len = 0xf;
  fs_print_error(path,fname);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

static std::string fs_convert_path(std::string_view path, FFS_MAYBE_UNUSED int const what)
{
#ifdef __CYGWIN__
  const auto L = cygwin_conv_path(what, path.data(), nullptr, 0);
  if(L > 0){
    if (std::string r(L, '\0'); !cygwin_conv_path(what, path.data(), r.data(), L))
      return r;
  }
#endif

  fs_print_error(path, __func__);
  return {};
}